

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImGuiTableCellData *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  short sVar6;
  ImGuiWindow *pIVar7;
  ImDrawList *pIVar8;
  ImGuiTableCellData *pIVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  ImGuiTableInstanceData *pIVar14;
  ImGuiTableColumn *p_1;
  ImGuiTableColumn *pIVar15;
  char *__function;
  long lVar16;
  int iVar17;
  int iVar18;
  ImGuiTableCellData *p;
  ImGuiTableCellData *pIVar19;
  int iVar20;
  ImU32 col;
  ImU32 col_00;
  uint uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  ImRect IVar25;
  ImRect row_rect;
  ImVec2 local_70;
  ImVec2 IStack_68;
  int local_5c;
  float local_58;
  ImU32 local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar13 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7 != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x6c9,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x6ca,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar13->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  fVar3 = table->RowPosY2;
  (pIVar7->DC).CursorPos.y = fVar3;
  fVar24 = table->RowPosY1;
  iVar17 = table->CurrentRow;
  iVar18 = (int)table->FreezeRowsCount;
  iVar20 = (int)table->FreezeRowsRequest;
  if (iVar17 == 0) {
    sVar6 = table->InstanceCurrent;
    if (sVar6 == 0) {
      pIVar14 = &table->InstanceDataFirst;
    }
    else {
      if ((sVar6 < 1) || ((table->InstanceDataExtra).Size < (int)sVar6)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x74f,
                      "T &ImVector<ImGuiTableInstanceData>::operator[](int) [T = ImGuiTableInstanceData]"
                     );
      }
      pIVar14 = (table->InstanceDataExtra).Data + ((ulong)(uint)(int)sVar6 - 1);
    }
    pIVar14->LastFirstRowHeight = fVar3 - fVar24;
  }
  iVar17 = iVar17 + 1;
  if (((table->InnerClipRect).Min.y <= fVar3) && (fVar24 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_48 = ZEXT416((uint)fVar24);
    local_58 = fVar3;
    local_50 = iVar20;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2f,1.0);
      fVar24 = (float)local_48._0_4_;
    }
    col = table->RowBgColor[1];
    local_54 = 0;
    if (col == 0x1000000) {
      col = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       (local_54 = 0, (table->Flags & 0x80) != 0)) {
      local_54 = table->RowBgColor[(ulong)((table->field_0x9a & 1) == 0) + 2];
    }
    cVar5 = table->RowCellDataCurrent;
    local_4c = iVar17;
    if ((-1 < cVar5 || iVar17 == iVar18) || (local_54 != 0 || (col != 0 || col_00 != 0))) {
      local_5c = CONCAT31(local_5c._1_3_,cVar5);
      if ((table->Flags & 0x100000) == 0) {
        pIVar8 = pIVar7->DrawList;
        fVar3 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar24 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar4 = (table->Bg0ClipRectForDrawCmd).Max.y;
        (pIVar8->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar8->_CmdHeader).ClipRect.y = fVar3;
        (pIVar8->_CmdHeader).ClipRect.z = fVar24;
        (pIVar8->_CmdHeader).ClipRect.w = fVar4;
      }
      ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,pIVar7->DrawList,0);
      fVar24 = (float)local_48._0_4_;
      cVar5 = (char)local_5c;
    }
    local_5c = iVar18;
    if (col != 0 || col_00 != 0) {
      fVar3 = (table->WorkRect).Min.x;
      IStack_68.x = (table->WorkRect).Max.x;
      fVar4 = (table->BgClipRect).Min.x;
      fVar23 = (table->BgClipRect).Min.y;
      uVar21 = -(uint)(fVar4 <= fVar3);
      uVar22 = -(uint)(fVar23 <= fVar24);
      local_70.y = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar24);
      local_70.x = (float)(~uVar21 & (uint)fVar4 | (uint)fVar3 & uVar21);
      fVar3 = (table->BgClipRect).Max.x;
      if (fVar3 <= IStack_68.x) {
        IStack_68.x = fVar3;
      }
      fVar3 = (table->BgClipRect).Max.y;
      IStack_68.y = local_58;
      if (fVar3 <= local_58) {
        IStack_68.y = fVar3;
      }
      if ((col_00 != 0) && (local_70.y < IStack_68.y)) {
        ImDrawList::AddRectFilled(pIVar7->DrawList,&local_70,&IStack_68,col_00,0.0,0);
      }
      if ((col != 0) && (local_70.y < IStack_68.y)) {
        ImDrawList::AddRectFilled(pIVar7->DrawList,&local_70,&IStack_68,col,0.0,0);
      }
    }
    if (-1 < cVar5) {
      if (-1 < (long)table->RowCellDataCurrent) {
        pIVar19 = (table->RowCellData).Data;
        pIVar9 = (table->RowCellData).DataEnd;
        pIVar1 = pIVar19 + table->RowCellDataCurrent;
        if ((pIVar1 < pIVar9) && (pIVar19 < pIVar9)) {
          do {
            if (((long)pIVar19->Column < 0) ||
               (pIVar15 = (table->Columns).Data + pIVar19->Column,
               (table->Columns).DataEnd <= pIVar15)) goto LAB_00194f0a;
            IVar25 = TableGetCellBgRect(table,(int)pIVar19->Column);
            local_70.x = IVar25.Min.x;
            local_70.y = IVar25.Min.y;
            fVar3 = (table->BgClipRect).Min.x;
            fVar24 = (table->BgClipRect).Min.y;
            uVar21 = -(uint)(fVar3 <= local_70.x);
            local_70.x = (float)(~uVar21 & (uint)fVar3 | (uint)local_70.x & uVar21);
            uVar21 = -(uint)(fVar24 <= local_70.y);
            local_70.y = (float)(~uVar21 & (uint)fVar24 | (uint)local_70.y & uVar21);
            IStack_68.x = IVar25.Max.x;
            fVar3 = (table->BgClipRect).Max.x;
            fVar24 = IStack_68.x;
            if (fVar3 <= IStack_68.x) {
              fVar24 = fVar3;
            }
            IStack_68.y = IVar25.Max.y;
            fVar3 = (table->BgClipRect).Max.y;
            fVar4 = IStack_68.y;
            if (fVar3 <= IStack_68.y) {
              fVar4 = fVar3;
            }
            IStack_68.y = fVar4;
            IStack_68.x = fVar24;
            fVar3 = (pIVar15->ClipRect).Min.x;
            uVar21 = -(uint)(fVar3 <= local_70.x);
            local_70.x = (float)(~uVar21 & (uint)fVar3 | (uint)local_70.x & uVar21);
            if (pIVar15->MaxX <= fVar24) {
              fVar24 = pIVar15->MaxX;
            }
            IStack_68.x = fVar24;
            ImDrawList::AddRectFilled(pIVar7->DrawList,&local_70,&IStack_68,pIVar19->BgColor,0.0,0);
            pIVar19 = pIVar19 + 1;
          } while (pIVar19 <= pIVar1);
          goto LAB_00194c7a;
        }
      }
      __function = "T &ImSpan<ImGuiTableCellData>::operator[](int) [T = ImGuiTableCellData]";
      goto LAB_00194f1f;
    }
LAB_00194c7a:
    if (((local_54 != 0) && ((table->BgClipRect).Min.y <= (float)local_48._0_4_)) &&
       ((float)local_48._0_4_ < (table->BgClipRect).Max.y)) {
      local_70.y = (float)local_48._0_4_;
      local_70.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = (float)local_48._0_4_;
      ImDrawList::AddLine(pIVar7->DrawList,&local_70,&local_38,local_54,1.0);
    }
    iVar17 = local_4c;
    iVar20 = local_50;
    iVar18 = local_5c;
    if (((local_4c == local_5c) && ((table->BgClipRect).Min.y <= local_58)) &&
       (local_58 < (table->BgClipRect).Max.y)) {
      local_70.y = local_58;
      local_70.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = local_58;
      ImDrawList::AddLine(pIVar7->DrawList,&local_70,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if ((iVar17 == iVar20) && (iVar20 = table->ColumnsCount, 0 < (long)iVar20)) {
    pIVar15 = (table->Columns).Data;
    lVar16 = 0;
    do {
      if ((table->Columns).DataEnd <= pIVar15) goto LAB_00194f0a;
      pIVar15->NavLayerCurrent = lVar16 < table->FreezeColumnsCount;
      lVar16 = lVar16 + 1;
      pIVar15 = pIVar15 + 1;
    } while (iVar20 != lVar16);
  }
  if (iVar17 == iVar18) {
    if (table->IsUnfrozenRows != false) {
      __assert_fail("table->IsUnfrozenRows == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x72f,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    table->IsUnfrozenRows = true;
    fVar3 = table->RowPosY2;
    fVar24 = (pIVar7->InnerClipRect).Min.y;
    fVar4 = (pIVar7->InnerClipRect).Max.y;
    uVar21 = -(uint)(fVar24 <= fVar3 + 1.0);
    fVar24 = (float)(~uVar21 & (uint)fVar24 | (uint)(fVar3 + 1.0) & uVar21);
    if (fVar4 <= fVar24) {
      fVar24 = fVar4;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar24;
    (table->BgClipRect).Min.y = fVar24;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar4;
    (table->BgClipRect).Max.y = fVar4;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    if (fVar4 < fVar24) {
      __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                    ,0x737,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    fVar4 = table->RowPosY1;
    fVar23 = (fVar3 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar7->DC).CursorPos.y = fVar23;
    table->RowPosY2 = fVar23;
    table->RowPosY1 = fVar23 - (fVar3 - fVar4);
    lVar16 = (long)table->ColumnsCount;
    if (0 < lVar16) {
      pIVar15 = (table->Columns).Data;
      do {
        if ((table->Columns).DataEnd <= pIVar15) goto LAB_00194f0a;
        pIVar15->DrawChannelCurrent = pIVar15->DrawChannelUnfrozen;
        (pIVar15->ClipRect).Min.y = fVar24;
        pIVar15 = pIVar15 + 1;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pIVar15 = (table->Columns).Data;
    if (pIVar15 < (table->Columns).DataEnd) {
      IVar11 = (pIVar15->ClipRect).Min;
      IVar12 = (pIVar15->ClipRect).Max;
      IVar10 = (pIVar15->ClipRect).Max;
      (pIVar7->ClipRect).Min = (pIVar15->ClipRect).Min;
      (pIVar7->ClipRect).Max = IVar10;
      pIVar8 = pIVar7->DrawList;
      (pIVar8->_CmdHeader).ClipRect.x = IVar11.x;
      (pIVar8->_CmdHeader).ClipRect.y = IVar11.y;
      (pIVar8->_CmdHeader).ClipRect.z = IVar12.x;
      (pIVar8->_CmdHeader).ClipRect.w = IVar12.y;
      pIVar2 = (pIVar7->DrawList->_ClipRectStack).Data +
               (long)(pIVar7->DrawList->_ClipRectStack).Size + -1;
      pIVar2->x = IVar11.x;
      pIVar2->y = IVar11.y;
      pIVar2->z = IVar12.x;
      pIVar2->w = IVar12.y;
      pIVar15 = (table->Columns).Data;
      if (pIVar15 < (table->Columns).DataEnd) {
        ImDrawListSplitter::SetCurrentChannel
                  (table->DrawSplitter,pIVar7->DrawList,(uint)pIVar15->DrawChannelCurrent);
        goto LAB_00194ee5;
      }
    }
LAB_00194f0a:
    __function = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_00194f1f:
    __assert_fail("p >= Data && p < DataEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                  ,599,__function);
  }
LAB_00194ee5:
  if ((table->field_0x98 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        TableGetInstanceData(table, table->InstanceCurrent)->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter->SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                // As we render the BG here we need to clip things (for layout we would not)
                // FIXME: This cancels the OuterPadding addition done by TableGetCellBgRect(), need to keep it while rendering correctly while scrolling.
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped when scrolling
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}